

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::descriptor_unittest::FileDescriptorTest_BuildAgainWithSyntax_Test::TestBody
          (FileDescriptorTest_BuildAgainWithSyntax_Test *this)

{
  InternalMetadata IVar1;
  DescriptorPool *this_00;
  char *pcVar2;
  char *in_R9;
  AssertionResult gtest_ar__2;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_340;
  AssertionResult gtest_ar__1;
  FileDescriptor *proto3_descriptor;
  AssertHelper local_310;
  FileDescriptor *implicit_proto2_descriptor;
  FileDescriptor *proto2_descriptor;
  FileDescriptorProto proto_syntax3;
  FileDescriptorProto implicit_proto2;
  FileDescriptorProto proto_syntax2;
  
  FileDescriptorProto::FileDescriptorProto(&proto_syntax2);
  proto_syntax2.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       proto_syntax2.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 1;
  IVar1 = proto_syntax2.super_Message.super_MessageLite._internal_metadata_;
  if ((proto_syntax2.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
    IVar1.ptr_ = *(undefined8 *)
                  (proto_syntax2.super_Message.super_MessageLite._internal_metadata_.ptr_ &
                  0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set
            (&proto_syntax2.field_0._impl_.name_,"foo_syntax2",(Arena *)IVar1.ptr_);
  proto_syntax2.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       proto_syntax2.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 4;
  if ((proto_syntax2.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
    proto_syntax2.super_Message.super_MessageLite._internal_metadata_.ptr_ =
         *(undefined8 *)
          (proto_syntax2.super_Message.super_MessageLite._internal_metadata_.ptr_ &
          0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set
            (&proto_syntax2.field_0._impl_.syntax_,"proto2",
             (Arena *)proto_syntax2.super_Message.super_MessageLite._internal_metadata_.ptr_);
  this_00 = &(this->super_FileDescriptorTest).pool_;
  proto2_descriptor = DescriptorPool::BuildFile(this_00,&proto_syntax2);
  proto_syntax3.super_Message.super_MessageLite._internal_metadata_.ptr_ = 0;
  proto_syntax3.super_Message.super_MessageLite._vptr_MessageLite =
       (_func_int **)
       CONCAT71(proto_syntax3.super_Message.super_MessageLite._vptr_MessageLite._1_7_,
                proto2_descriptor != (FileDescriptor *)0x0);
  if (proto2_descriptor == (FileDescriptor *)0x0) {
    testing::Message::Message((Message *)&gtest_ar__1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&implicit_proto2,(internal *)&proto_syntax3,(AssertionResult *)0xd5f057,
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x1db,(char *)CONCAT71(implicit_proto2.super_Message.super_MessageLite.
                                       _vptr_MessageLite._1_7_,
                                       (char)implicit_proto2.super_Message.super_MessageLite.
                                             _vptr_MessageLite));
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2,(Message *)&gtest_ar__1)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
    std::__cxx11::string::~string((string *)&implicit_proto2);
    if (gtest_ar__1._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__1._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&proto_syntax3.super_Message.super_MessageLite._internal_metadata_);
  proto_syntax3.super_Message.super_MessageLite._vptr_MessageLite =
       (_func_int **)DescriptorPool::BuildFile(this_00,&proto_syntax2);
  testing::internal::
  CmpHelperEQ<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*>
            ((internal *)&implicit_proto2,"proto2_descriptor","pool_.BuildFile(proto_syntax2)",
             &proto2_descriptor,(FileDescriptor **)&proto_syntax3);
  if ((char)implicit_proto2.super_Message.super_MessageLite._vptr_MessageLite == '\0') {
    testing::Message::Message((Message *)&proto_syntax3);
    if (implicit_proto2.super_Message.super_MessageLite._internal_metadata_.ptr_ == 0) {
      pcVar2 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar2 = *(char **)implicit_proto2.super_Message.super_MessageLite._internal_metadata_.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x1dc,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar__1,(Message *)&proto_syntax3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1);
    if (proto_syntax3.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0) {
      (**(code **)(*proto_syntax3.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&implicit_proto2.super_Message.super_MessageLite._internal_metadata_);
  FileDescriptorProto::FileDescriptorProto(&implicit_proto2);
  implicit_proto2.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       implicit_proto2.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 1;
  IVar1 = implicit_proto2.super_Message.super_MessageLite._internal_metadata_;
  if ((implicit_proto2.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
    IVar1.ptr_ = *(undefined8 *)
                  (implicit_proto2.super_Message.super_MessageLite._internal_metadata_.ptr_ &
                  0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set
            (&implicit_proto2.field_0._impl_.name_,"foo_implicit_syntax2",(Arena *)IVar1.ptr_);
  implicit_proto2_descriptor = DescriptorPool::BuildFile(this_00,&implicit_proto2);
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar__1.success_ = implicit_proto2_descriptor != (FileDescriptor *)0x0;
  if (implicit_proto2_descriptor == (FileDescriptor *)0x0) {
    testing::Message::Message((Message *)&gtest_ar__2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&proto_syntax3,(internal *)&gtest_ar__1,
               (AssertionResult *)"implicit_proto2_descriptor != nullptr","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&proto3_descriptor,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x1e3,(char *)proto_syntax3.super_Message.super_MessageLite._vptr_MessageLite);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&proto3_descriptor,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&proto3_descriptor);
    std::__cxx11::string::~string((string *)&proto_syntax3);
    if (gtest_ar__2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__1.message_);
  implicit_proto2.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       implicit_proto2.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 4;
  if ((implicit_proto2.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
    implicit_proto2.super_Message.super_MessageLite._internal_metadata_.ptr_ =
         *(undefined8 *)
          (implicit_proto2.super_Message.super_MessageLite._internal_metadata_.ptr_ &
          0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set
            (&implicit_proto2.field_0._impl_.syntax_,"proto2",
             (Arena *)implicit_proto2.super_Message.super_MessageLite._internal_metadata_.ptr_);
  gtest_ar__1._0_8_ = DescriptorPool::BuildFile(this_00,&implicit_proto2);
  testing::internal::
  CmpHelperEQ<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*>
            ((internal *)&proto_syntax3,"implicit_proto2_descriptor",
             "pool_.BuildFile(implicit_proto2)",&implicit_proto2_descriptor,
             (FileDescriptor **)&gtest_ar__1);
  if ((char)proto_syntax3.super_Message.super_MessageLite._vptr_MessageLite == '\0') {
    testing::Message::Message((Message *)&gtest_ar__1);
    if (proto_syntax3.super_Message.super_MessageLite._internal_metadata_.ptr_ == 0) {
      pcVar2 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar2 = *(char **)proto_syntax3.super_Message.super_MessageLite._internal_metadata_.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x1e7,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2,(Message *)&gtest_ar__1)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
    if (gtest_ar__1._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__1._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&proto_syntax3.super_Message.super_MessageLite._internal_metadata_);
  FileDescriptorProto::FileDescriptorProto(&proto_syntax3);
  proto_syntax3.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       proto_syntax3.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 1;
  IVar1 = proto_syntax3.super_Message.super_MessageLite._internal_metadata_;
  if ((proto_syntax3.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
    IVar1.ptr_ = *(undefined8 *)
                  (proto_syntax3.super_Message.super_MessageLite._internal_metadata_.ptr_ &
                  0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set
            (&proto_syntax3.field_0._impl_.name_,"foo_syntax3",(Arena *)IVar1.ptr_);
  proto_syntax3.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       proto_syntax3.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 4;
  IVar1 = proto_syntax3.super_Message.super_MessageLite._internal_metadata_;
  if ((proto_syntax3.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
    IVar1.ptr_ = *(undefined8 *)
                  (proto_syntax3.super_Message.super_MessageLite._internal_metadata_.ptr_ &
                  0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set(&proto_syntax3.field_0._impl_.syntax_,"proto3",(Arena *)IVar1.ptr_);
  proto3_descriptor = DescriptorPool::BuildFile(this_00,&proto_syntax3);
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar__2.success_ = proto3_descriptor != (FileDescriptor *)0x0;
  if (proto3_descriptor == (FileDescriptor *)0x0) {
    testing::Message::Message((Message *)&local_340);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1,(internal *)&gtest_ar__2,
               (AssertionResult *)"proto3_descriptor != nullptr","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_310,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x1ee,(char *)gtest_ar__1._0_8_);
    testing::internal::AssertHelper::operator=(&local_310,(Message *)&local_340);
    testing::internal::AssertHelper::~AssertHelper(&local_310);
    std::__cxx11::string::~string((string *)&gtest_ar__1);
    if (local_340._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_340._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__2.message_);
  gtest_ar__2._0_8_ = DescriptorPool::BuildFile(this_00,&proto_syntax3);
  testing::internal::
  CmpHelperEQ<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*>
            ((internal *)&gtest_ar__1,"proto3_descriptor","pool_.BuildFile(proto_syntax3)",
             &proto3_descriptor,(FileDescriptor **)&gtest_ar__2);
  if (gtest_ar__1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__2);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar2 = *(char **)gtest_ar__1.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_340,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x1ef,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_340,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_340);
    if (gtest_ar__2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__1.message_);
  FileDescriptorProto::~FileDescriptorProto(&proto_syntax3);
  FileDescriptorProto::~FileDescriptorProto(&implicit_proto2);
  FileDescriptorProto::~FileDescriptorProto(&proto_syntax2);
  return;
}

Assistant:

TEST_F(FileDescriptorTest, BuildAgainWithSyntax) {
  // Test that if we call BuildFile again on the same input we get the same
  // FileDescriptor back even if syntax param is specified.
  FileDescriptorProto proto_syntax2;
  proto_syntax2.set_name("foo_syntax2");
  proto_syntax2.set_syntax("proto2");

  const FileDescriptor* proto2_descriptor = pool_.BuildFile(proto_syntax2);
  EXPECT_TRUE(proto2_descriptor != nullptr);
  EXPECT_EQ(proto2_descriptor, pool_.BuildFile(proto_syntax2));

  FileDescriptorProto implicit_proto2;
  implicit_proto2.set_name("foo_implicit_syntax2");

  const FileDescriptor* implicit_proto2_descriptor =
      pool_.BuildFile(implicit_proto2);
  EXPECT_TRUE(implicit_proto2_descriptor != nullptr);
  // We get the same FileDescriptor back if syntax param is explicitly
  // specified.
  implicit_proto2.set_syntax("proto2");
  EXPECT_EQ(implicit_proto2_descriptor, pool_.BuildFile(implicit_proto2));

  FileDescriptorProto proto_syntax3;
  proto_syntax3.set_name("foo_syntax3");
  proto_syntax3.set_syntax("proto3");

  const FileDescriptor* proto3_descriptor = pool_.BuildFile(proto_syntax3);
  EXPECT_TRUE(proto3_descriptor != nullptr);
  EXPECT_EQ(proto3_descriptor, pool_.BuildFile(proto_syntax3));
}